

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O1

void __thiscall vpl::Scope::LoadVariableAddr(Scope *this,string *name)

{
  bool bVar1;
  pointer pNVar2;
  pointer pNVar3;
  ostream *poVar4;
  const_iterator cVar5;
  runtime_error *this_00;
  long lVar6;
  char *pcVar7;
  pointer pNVar8;
  stringstream ss;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_1b8[0] = (stringstream)0x23;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(this->out_,(char *)local_1b8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"void vpl::Scope::LoadVariableAddr(const std::string &)",0x36);
  local_1b8[0] = (stringstream)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1b8,1);
  pNVar3 = (this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    pNVar8 = pNVar3;
    pNVar2 = (this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pNVar8 == pNVar2) goto LAB_0011e92e;
    cVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&pNVar8[-1].offsets_._M_h,name);
    pNVar3 = pNVar8 + -1;
  } while (cVar5.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
           ._M_cur == (__node_type *)0x0);
  poVar4 = this->out_;
  bVar1 = pNVar8[-1].is_global_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    push ",9);
  if (bVar1 == false) {
    cVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&pNVar8[-1].offsets_._M_h,name);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar4,
                        *(int *)((long)cVar5.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                       ._M_cur + 0x28));
    local_1b8[0] = (stringstream)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1b8,1);
    poVar4 = this->out_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    push %",10);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,1);
    local_1b8[0] = (stringstream)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1b8,1);
    poVar4 = this->out_;
    pcVar7 = "    add\n";
    lVar6 = 8;
  }
  else {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(name->_M_dataplus)._M_p,name->_M_string_length);
    pcVar7 = (char *)local_1b8;
    local_1b8[0] = (stringstream)0xa;
    lVar6 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar6);
  this->cur_stack_pos_ = this->cur_stack_pos_ + 1;
  if (pNVar8 != pNVar2) {
    return;
  }
LAB_0011e92e:
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Undefined variable `",0x14);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
  local_1d8[0] = (string)0x60;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1d8,1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1d8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LoadVariableAddr(const std::string& name) {
        LOG
        for (auto iter = scopes_.rbegin(); iter != scopes_.rend(); ++iter) {
            if (iter->Contains(name)) {
                if (!iter->IsGlobal()) {
                    out_ << "    push " << iter->GetOffset(name) << '\n';
                    out_ << "    push %" << StackPointerRegister() << '\n';
                    out_ << "    add\n";
                } else {
                    out_ << "    push " << name << '\n';
                }
                ++cur_stack_pos_;
                return;
            }
        }
        std::stringstream ss;
        ss << "Undefined variable `" << name << '`';
        throw std::runtime_error(ss.str());
    }